

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledWriter::isMultilineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  int iVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  ArrayIndex index_1;
  ArrayIndex lineLength;
  Value *childValue;
  ArrayIndex index;
  bool isMultiLine;
  ArrayIndex size;
  ArrayIndex in_stack_000001c4;
  Value *in_stack_000001c8;
  Value *in_stack_00000208;
  StyledWriter *in_stack_00000210;
  Value *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  byte in_stack_ffffffffffffffc6;
  byte bVar4;
  undefined4 local_30;
  undefined4 local_2c;
  Value *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  
  AVar2 = Value::size(in_stack_ffffffffffffffd8);
  uVar5 = CONCAT13(*(uint *)(in_RDI + 0x60) <= AVar2 * 3,(int3)in_stack_ffffffffffffffe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x20a725);
  local_1c = 0;
  do {
    bVar4 = 0;
    if (local_1c < AVar2) {
      bVar4 = (byte)(uVar5 >> 0x18) ^ 0xff;
    }
    if ((bVar4 & 1) == 0) {
      if ((uVar5 & 0x1000000) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(in_RSI,CONCAT44(AVar2,uVar5));
        *(undefined1 *)(in_RDI + 0x68) = 1;
        local_2c = (AVar2 - 1) * 2 + 4;
        for (local_30 = 0; local_30 < AVar2; local_30 = local_30 + 1) {
          Value::operator[](in_stack_000001c8,in_stack_000001c4);
          bVar1 = hasCommentForValue((Value *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffc6,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffffc5,
                                                  in_stack_ffffffffffffffc0))));
          if (bVar1) {
            uVar5 = 0x1000000;
          }
          Value::operator[](in_stack_000001c8,in_stack_000001c4);
          writeValue(in_stack_00000210,in_stack_00000208);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 8),(ulong)local_30);
          iVar3 = std::__cxx11::string::length();
          local_2c = iVar3 + local_2c;
        }
        *(undefined1 *)(in_RDI + 0x68) = 0;
        bVar1 = true;
        if ((uVar5 & 0x1000000) == 0) {
          bVar1 = *(uint *)(in_RDI + 0x60) <= local_2c;
        }
        uVar5 = (uint)bVar1 << 0x18;
      }
      return (bool)((byte)(uVar5 >> 0x18) & 1);
    }
    Value::operator[](in_stack_000001c8,in_stack_000001c4);
    bVar1 = Value::isArray((Value *)0x20a76e);
    if (bVar1) {
LAB_0020a78b:
      bVar1 = Value::empty(in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc6 = bVar1 ^ 0xff;
    }
    else {
      bVar1 = Value::isObject((Value *)0x20a77c);
      in_stack_ffffffffffffffc6 = 0;
      if (bVar1) goto LAB_0020a78b;
    }
    uVar5 = CONCAT13(in_stack_ffffffffffffffc6,(int3)uVar5) & 0x1ffffff;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool StyledWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}